

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to1.h
# Opt level: O3

void ncnn::im2col_sgemm_pack4to1_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  int *piVar66;
  ulong uVar67;
  void **ppvVar68;
  ulong uVar69;
  long lVar70;
  float *pfVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  uint uVar75;
  undefined4 *puVar76;
  long lVar77;
  float *pfVar78;
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  float *pfVar82;
  int iVar83;
  undefined4 *puVar84;
  int iVar85;
  float *pfVar86;
  char cVar87;
  void **ppvVar88;
  long lVar89;
  float *pfVar90;
  long lVar91;
  void **ppvVar92;
  uint uVar93;
  float *pfVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float zeros [4];
  Mat local_e8;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  Mat *local_80;
  long local_78;
  long local_70;
  uint local_64;
  Mat *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  void *local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  uVar3 = bottom_im2col->w;
  lVar89 = (long)(int)uVar3;
  iVar72 = bottom_im2col->h;
  uVar80 = bottom_im2col->c;
  uVar67 = (ulong)uVar80;
  local_70 = (long)top_blob->c;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  local_80 = _bias;
  local_60 = top_blob;
  if (lVar89 < 0xc) {
    if ((int)uVar3 < 8) {
      uVar93 = uVar3;
      iVar85 = iVar72;
      if (3 < (int)uVar3) {
        iVar85 = iVar72 * 4;
        uVar93 = (uVar3 & 3) + 1;
      }
    }
    else {
      uVar93 = (uVar3 & 3) + 1 + (uint)((uVar3 >> 2 & 1) != 0);
      iVar85 = iVar72 * 8;
    }
    Mat::create(&local_e8,iVar85,uVar80,uVar93,0x10,4,(Allocator *)opt);
    uVar93 = (int)uVar3 / 0xc;
  }
  else {
    uVar93 = uVar3 / 0xc;
    uVar79 = uVar3 % 0xc;
    Mat::create(&local_e8,iVar72 * 0xc,uVar80,
                (uVar79 & 3) + (uVar79 >> 3) + uVar3 / 0xc + (uint)((uVar79 >> 2 & 1) != 0),0x10,4,
                (Allocator *)opt);
    uVar69 = 0;
    do {
      if (0 < (int)uVar80) {
        puVar76 = (undefined4 *)
                  (local_e8.cstep * uVar69 *
                   CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                  (long)local_e8.data);
        uVar81 = 0;
        do {
          if (0 < iVar72) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar81 +
                      ((long)((uVar69 << 0x24) * 3) >> 0x1e) + 0xb0);
            iVar85 = iVar72;
            do {
              uVar7 = puVar84[-0x2b];
              uVar8 = puVar84[-0x2a];
              uVar9 = puVar84[-0x29];
              uVar10 = puVar84[-0x28];
              uVar11 = puVar84[-0x27];
              uVar12 = puVar84[-0x26];
              uVar13 = puVar84[-0x25];
              uVar14 = puVar84[-0x24];
              uVar15 = puVar84[-0x23];
              uVar16 = puVar84[-0x22];
              uVar17 = puVar84[-0x21];
              uVar18 = puVar84[-0x20];
              uVar19 = puVar84[-0x1f];
              uVar20 = puVar84[-0x1e];
              uVar21 = puVar84[-0x1d];
              uVar22 = puVar84[-0x1c];
              uVar23 = puVar84[-0x1b];
              uVar24 = puVar84[-0x1a];
              uVar25 = puVar84[-0x19];
              uVar26 = puVar84[-0x18];
              uVar27 = puVar84[-0x17];
              uVar28 = puVar84[-0x16];
              uVar29 = puVar84[-0x15];
              uVar30 = puVar84[-0x14];
              uVar31 = puVar84[-0x13];
              uVar32 = puVar84[-0x12];
              uVar33 = puVar84[-0x11];
              uVar34 = puVar84[-0x10];
              uVar35 = puVar84[-0xf];
              uVar36 = puVar84[-0xe];
              uVar37 = puVar84[-0xd];
              uVar38 = puVar84[-0xc];
              uVar39 = puVar84[-0xb];
              uVar40 = puVar84[-10];
              uVar41 = puVar84[-9];
              uVar42 = puVar84[-8];
              uVar43 = puVar84[-7];
              uVar44 = puVar84[-6];
              uVar45 = puVar84[-5];
              uVar46 = puVar84[-4];
              uVar47 = puVar84[-3];
              uVar48 = puVar84[-2];
              uVar49 = puVar84[-1];
              uVar50 = *puVar84;
              uVar51 = puVar84[1];
              uVar52 = puVar84[2];
              uVar53 = puVar84[3];
              *puVar76 = puVar84[-0x2c];
              puVar76[1] = uVar10;
              puVar76[2] = uVar14;
              puVar76[3] = uVar18;
              puVar76[4] = uVar22;
              puVar76[5] = uVar26;
              puVar76[6] = uVar30;
              puVar76[7] = uVar34;
              puVar76[8] = uVar38;
              puVar76[9] = uVar42;
              puVar76[10] = uVar46;
              puVar76[0xb] = uVar50;
              puVar76[0xc] = uVar7;
              puVar76[0xd] = uVar11;
              puVar76[0xe] = uVar15;
              puVar76[0xf] = uVar19;
              puVar76[0x10] = uVar23;
              puVar76[0x11] = uVar27;
              puVar76[0x12] = uVar31;
              puVar76[0x13] = uVar35;
              puVar76[0x14] = uVar39;
              puVar76[0x15] = uVar43;
              puVar76[0x16] = uVar47;
              puVar76[0x17] = uVar51;
              puVar76[0x18] = uVar8;
              puVar76[0x19] = uVar12;
              puVar76[0x1a] = uVar16;
              puVar76[0x1b] = uVar20;
              puVar76[0x1c] = uVar24;
              puVar76[0x1d] = uVar28;
              puVar76[0x1e] = uVar32;
              puVar76[0x1f] = uVar36;
              puVar76[0x20] = uVar40;
              puVar76[0x21] = uVar44;
              puVar76[0x22] = uVar48;
              puVar76[0x23] = uVar52;
              puVar76[0x24] = uVar9;
              puVar76[0x25] = uVar13;
              puVar76[0x26] = uVar17;
              puVar76[0x27] = uVar21;
              puVar76[0x28] = uVar25;
              puVar76[0x29] = uVar29;
              puVar76[0x2a] = uVar33;
              puVar76[0x2b] = uVar37;
              puVar76[0x2c] = uVar41;
              puVar76[0x2d] = uVar45;
              puVar76[0x2e] = uVar49;
              puVar76[0x2f] = uVar53;
              puVar76 = puVar76 + 0x30;
              puVar84 = puVar84 + uVar3 * 4;
              iVar85 = iVar85 + -1;
            } while (iVar85 != 0);
          }
          uVar81 = uVar81 + 1;
        } while (uVar81 != uVar67);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 != uVar3 / 0xc);
  }
  iVar85 = uVar93 * 0xc;
  uVar93 = uVar3 + uVar93 * -0xc;
  uVar79 = (int)uVar93 >> 3;
  if (0 < (int)uVar79) {
    lVar77 = (long)iVar85 * 0x10 + 0x40;
    uVar69 = 0;
    do {
      if (0 < (int)uVar80) {
        iVar83 = iVar85 + (int)uVar69 * 8;
        iVar73 = iVar83 / 0xc;
        cVar87 = (char)iVar83 + (char)iVar73 * -0xc;
        puVar76 = (undefined4 *)
                  ((long)(((char)(((byte)(cVar87 >> 7) >> 5) + cVar87) >> 3) + iVar73) *
                   local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize)
                  + (long)local_e8.data);
        uVar81 = 0;
        do {
          if (0 < iVar72) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar81 + lVar77);
            iVar73 = iVar72;
            do {
              uVar7 = puVar84[-0xf];
              uVar8 = puVar84[-0xe];
              uVar9 = puVar84[-0xd];
              uVar10 = puVar84[-0xc];
              uVar11 = puVar84[-0xb];
              uVar12 = puVar84[-10];
              uVar13 = puVar84[-9];
              uVar14 = puVar84[-8];
              uVar15 = puVar84[-7];
              uVar16 = puVar84[-6];
              uVar17 = puVar84[-5];
              uVar18 = puVar84[-4];
              uVar19 = puVar84[-3];
              uVar20 = puVar84[-2];
              uVar21 = puVar84[-1];
              uVar22 = *puVar84;
              uVar23 = puVar84[1];
              uVar24 = puVar84[2];
              uVar25 = puVar84[3];
              uVar26 = puVar84[4];
              uVar27 = puVar84[5];
              uVar28 = puVar84[6];
              uVar29 = puVar84[7];
              uVar30 = puVar84[8];
              uVar31 = puVar84[9];
              uVar32 = puVar84[10];
              uVar33 = puVar84[0xb];
              uVar34 = puVar84[0xc];
              uVar35 = puVar84[0xd];
              uVar36 = puVar84[0xe];
              uVar37 = puVar84[0xf];
              *puVar76 = puVar84[-0x10];
              puVar76[1] = uVar10;
              puVar76[2] = uVar14;
              puVar76[3] = uVar18;
              puVar76[4] = uVar22;
              puVar76[5] = uVar26;
              puVar76[6] = uVar30;
              puVar76[7] = uVar34;
              puVar76[8] = uVar7;
              puVar76[9] = uVar11;
              puVar76[10] = uVar15;
              puVar76[0xb] = uVar19;
              puVar76[0xc] = uVar23;
              puVar76[0xd] = uVar27;
              puVar76[0xe] = uVar31;
              puVar76[0xf] = uVar35;
              puVar76[0x10] = uVar8;
              puVar76[0x11] = uVar12;
              puVar76[0x12] = uVar16;
              puVar76[0x13] = uVar20;
              puVar76[0x14] = uVar24;
              puVar76[0x15] = uVar28;
              puVar76[0x16] = uVar32;
              puVar76[0x17] = uVar36;
              puVar76[0x18] = uVar9;
              puVar76[0x19] = uVar13;
              puVar76[0x1a] = uVar17;
              puVar76[0x1b] = uVar21;
              puVar76[0x1c] = uVar25;
              puVar76[0x1d] = uVar29;
              puVar76[0x1e] = uVar33;
              puVar76[0x1f] = uVar37;
              puVar76 = puVar76 + 0x20;
              puVar84 = puVar84 + (int)(uVar3 * 4);
              iVar73 = iVar73 + -1;
            } while (iVar73 != 0);
          }
          uVar81 = uVar81 + 1;
        } while (uVar81 != uVar67);
      }
      uVar69 = uVar69 + 1;
      lVar77 = lVar77 + 0x80;
    } while (uVar69 != uVar79);
  }
  iVar85 = (uVar93 & 0xfffffff8) + iVar85;
  uVar93 = (int)(uVar3 - iVar85) >> 2;
  if (0 < (int)uVar93) {
    lVar77 = (long)iVar85 * 0x10 + 0x30;
    uVar69 = 0;
    do {
      if (0 < (int)uVar80) {
        iVar83 = iVar85 + (int)uVar69 * 4;
        iVar73 = iVar83 / 0xc;
        cVar87 = (char)iVar83 + (char)iVar73 * -0xc;
        puVar76 = (undefined4 *)
                  ((long)((int)(char)(cVar87 % '\b' >> 2) +
                         ((char)(((byte)(cVar87 >> 7) >> 5) + cVar87) >> 3) + iVar73) *
                   local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize)
                  + (long)local_e8.data);
        uVar81 = 0;
        do {
          if (0 < iVar72) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar81 + lVar77);
            iVar73 = iVar72;
            do {
              uVar7 = puVar84[-0xb];
              uVar8 = puVar84[-10];
              uVar9 = puVar84[-9];
              uVar10 = puVar84[-8];
              uVar11 = puVar84[-7];
              uVar12 = puVar84[-6];
              uVar13 = puVar84[-5];
              uVar14 = puVar84[-4];
              uVar15 = puVar84[-3];
              uVar16 = puVar84[-2];
              uVar17 = puVar84[-1];
              uVar18 = *puVar84;
              uVar19 = puVar84[1];
              uVar20 = puVar84[2];
              uVar21 = puVar84[3];
              *puVar76 = puVar84[-0xc];
              puVar76[1] = uVar10;
              puVar76[2] = uVar14;
              puVar76[3] = uVar18;
              puVar76[4] = uVar7;
              puVar76[5] = uVar11;
              puVar76[6] = uVar15;
              puVar76[7] = uVar19;
              puVar76[8] = uVar8;
              puVar76[9] = uVar12;
              puVar76[10] = uVar16;
              puVar76[0xb] = uVar20;
              puVar76[0xc] = uVar9;
              puVar76[0xd] = uVar13;
              puVar76[0xe] = uVar17;
              puVar76[0xf] = uVar21;
              puVar76 = puVar76 + 0x10;
              puVar84 = puVar84 + (int)(uVar3 * 4);
              iVar73 = iVar73 + -1;
            } while (iVar73 != 0);
          }
          uVar81 = uVar81 + 1;
        } while (uVar81 != uVar67);
      }
      uVar69 = uVar69 + 1;
      lVar77 = lVar77 + 0x40;
    } while (uVar69 != uVar93);
  }
  iVar85 = (uVar3 - iVar85 & 0xfffffffc) + iVar85;
  if (iVar85 < (int)uVar3) {
    lVar77 = (long)iVar85;
    lVar70 = lVar77 << 4;
    do {
      if (0 < (int)uVar80) {
        iVar85 = (int)lVar77 / 0xc;
        cVar87 = (char)lVar77 + (char)iVar85 * -0xc;
        puVar76 = (undefined4 *)
                  ((long)((int)((char)(((byte)(cVar87 % '\b' >> 7) >> 6) + cVar87 % '\b') >> 2) +
                         (int)(cVar87 % '\x04') +
                         ((char)(((byte)(cVar87 >> 7) >> 5) + cVar87) >> 3) + iVar85) *
                   local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize)
                  + (long)local_e8.data);
        uVar69 = 0;
        do {
          if (0 < iVar72) {
            puVar84 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar69 + lVar70);
            iVar85 = iVar72;
            do {
              uVar7 = puVar84[1];
              uVar8 = puVar84[2];
              uVar9 = puVar84[3];
              *puVar76 = *puVar84;
              puVar76[1] = uVar7;
              puVar76[2] = uVar8;
              puVar76[3] = uVar9;
              puVar76 = puVar76 + 4;
              puVar84 = puVar84 + (int)(uVar3 * 4);
              iVar85 = iVar85 + -1;
            } while (iVar85 != 0);
          }
          uVar69 = uVar69 + 1;
        } while (uVar69 != uVar67);
      }
      lVar77 = lVar77 + 1;
      lVar70 = lVar70 + 0x10;
    } while (lVar77 < lVar89);
  }
  uVar93 = (uint)local_70;
  uVar79 = uVar93 + 3;
  if (-1 < (int)uVar93) {
    uVar79 = uVar93;
  }
  local_64 = uVar79 & 0xfffffffc;
  if (3 < (int)uVar93) {
    iVar85 = uVar80 * iVar72;
    iVar73 = iVar85 * 4;
    local_38 = (ulong)(uint)((int)uVar79 >> 2);
    uVar67 = 0;
    do {
      uVar69 = uVar67;
      sVar4 = local_60->cstep;
      pvVar5 = local_60->data;
      sVar6 = local_60->elemsize;
      pfVar78 = (float *)(uVar69 * 4 * sVar4 * sVar6 + (long)pvVar5);
      pfVar82 = (float *)((uVar69 * 4 + 1) * sVar4 * sVar6 + (long)pvVar5);
      pfVar86 = (float *)((uVar69 * 4 + 2) * sVar4 * sVar6 + (long)pvVar5);
      pfVar94 = (float *)((uVar69 * 4 + 3) * sVar4 * sVar6 + (long)pvVar5);
      ppvVar92 = &local_80->data + uVar69 * 2;
      ppvVar88 = ppvVar92;
      if (local_80 == (Mat *)0x0) {
        ppvVar88 = &local_48;
      }
      local_48 = (void *)0x0;
      uStack_40 = 0;
      if ((int)uVar3 < 0xc) {
        uVar67 = 0;
      }
      else {
        ppvVar68 = ppvVar92;
        if (local_80 == (Mat *)0x0) {
          ppvVar68 = &local_48;
        }
        uVar81 = 0;
        do {
          fVar103 = *(float *)ppvVar88;
          fVar119 = *(float *)((long)ppvVar68 + 4);
          fVar95 = *(float *)(ppvVar68 + 1);
          fVar99 = *(float *)((long)ppvVar68 + 0xc);
          fVar100 = fVar99;
          fVar101 = fVar99;
          fVar102 = fVar99;
          fVar96 = fVar95;
          fVar97 = fVar95;
          fVar98 = fVar95;
          fVar104 = fVar103;
          fVar105 = fVar103;
          fVar106 = fVar103;
          fVar107 = fVar99;
          fVar108 = fVar99;
          fVar109 = fVar99;
          fVar110 = fVar99;
          fVar111 = fVar99;
          fVar112 = fVar99;
          fVar113 = fVar99;
          fVar114 = fVar99;
          fVar115 = fVar95;
          fVar116 = fVar95;
          fVar117 = fVar95;
          fVar118 = fVar95;
          fVar120 = fVar119;
          fVar121 = fVar119;
          fVar122 = fVar119;
          fVar123 = fVar119;
          fVar124 = fVar119;
          fVar125 = fVar119;
          fVar126 = fVar119;
          fVar127 = fVar103;
          fVar128 = fVar103;
          fVar129 = fVar103;
          fVar130 = fVar103;
          fVar131 = fVar103;
          fVar132 = fVar103;
          fVar133 = fVar103;
          fVar134 = fVar103;
          fStack_90 = fVar95;
          fStack_8c = fVar95;
          local_58 = fVar119;
          fStack_54 = fVar119;
          fStack_50 = fVar119;
          fStack_4c = fVar119;
          if (iVar85 * 4 < 1) {
            local_98 = CONCAT44(fVar95,fVar95);
          }
          else {
            pfVar90 = (float *)(kernel->cstep * uVar69 * kernel->elemsize + (long)kernel->data);
            pfVar71 = (float *)((uVar81 / 0xc) * local_e8.cstep *
                                CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                               (long)local_e8.data);
            local_98 = CONCAT44(fVar95,fVar95);
            iVar83 = iVar73;
            do {
              fVar54 = *pfVar71;
              fVar55 = pfVar71[1];
              fVar56 = pfVar71[2];
              fVar57 = pfVar71[3];
              fVar58 = pfVar71[4];
              fVar59 = pfVar71[5];
              fVar60 = pfVar71[6];
              fVar61 = pfVar71[7];
              fVar62 = pfVar71[8];
              fVar63 = pfVar71[9];
              fVar64 = pfVar71[10];
              fVar65 = pfVar71[0xb];
              fVar1 = *pfVar90;
              fVar103 = fVar103 + fVar1 * fVar54;
              fVar104 = fVar104 + fVar1 * fVar55;
              fVar105 = fVar105 + fVar1 * fVar56;
              fVar106 = fVar106 + fVar1 * fVar57;
              fVar131 = fVar131 + fVar1 * fVar58;
              fVar132 = fVar132 + fVar1 * fVar59;
              fVar133 = fVar133 + fVar1 * fVar60;
              fVar134 = fVar134 + fVar1 * fVar61;
              fVar2 = pfVar90[1];
              fVar127 = fVar127 + fVar1 * fVar62;
              fVar128 = fVar128 + fVar1 * fVar63;
              fVar129 = fVar129 + fVar1 * fVar64;
              fVar130 = fVar130 + fVar1 * fVar65;
              local_58 = local_58 + fVar2 * fVar54;
              fStack_54 = fStack_54 + fVar2 * fVar55;
              fStack_50 = fStack_50 + fVar2 * fVar56;
              fStack_4c = fStack_4c + fVar2 * fVar57;
              fVar123 = fVar123 + fVar2 * fVar58;
              fVar124 = fVar124 + fVar2 * fVar59;
              fVar125 = fVar125 + fVar2 * fVar60;
              fVar126 = fVar126 + fVar2 * fVar61;
              fVar1 = pfVar90[2];
              fVar119 = fVar119 + fVar2 * fVar62;
              fVar120 = fVar120 + fVar2 * fVar63;
              fVar121 = fVar121 + fVar2 * fVar64;
              fVar122 = fVar122 + fVar2 * fVar65;
              fVar115 = fVar115 + fVar1 * fVar54;
              fVar116 = fVar116 + fVar1 * fVar55;
              fVar117 = fVar117 + fVar1 * fVar56;
              fVar118 = fVar118 + fVar1 * fVar57;
              fStack_90 = fStack_90 + fVar1 * fVar60;
              fStack_8c = fStack_8c + fVar1 * fVar61;
              local_98 = CONCAT44(local_98._4_4_ + fVar1 * fVar59,(float)local_98 + fVar1 * fVar58);
              fVar95 = fVar95 + fVar1 * fVar62;
              fVar96 = fVar96 + fVar1 * fVar63;
              fVar97 = fVar97 + fVar1 * fVar64;
              fVar98 = fVar98 + fVar1 * fVar65;
              fVar1 = pfVar90[3];
              fVar111 = fVar111 + fVar54 * fVar1;
              fVar112 = fVar112 + fVar55 * fVar1;
              fVar113 = fVar113 + fVar56 * fVar1;
              fVar114 = fVar114 + fVar57 * fVar1;
              fVar107 = fVar107 + fVar58 * fVar1;
              fVar108 = fVar108 + fVar59 * fVar1;
              fVar109 = fVar109 + fVar60 * fVar1;
              fVar110 = fVar110 + fVar61 * fVar1;
              fVar99 = fVar99 + fVar1 * fVar62;
              fVar100 = fVar100 + fVar1 * fVar63;
              fVar101 = fVar101 + fVar1 * fVar64;
              fVar102 = fVar102 + fVar1 * fVar65;
              pfVar71 = pfVar71 + 0xc;
              pfVar90 = pfVar90 + 4;
              iVar83 = iVar83 + -1;
            } while (iVar83 != 0);
          }
          *pfVar78 = fVar103;
          pfVar78[1] = fVar104;
          pfVar78[2] = fVar105;
          pfVar78[3] = fVar106;
          pfVar78[4] = fVar131;
          pfVar78[5] = fVar132;
          pfVar78[6] = fVar133;
          pfVar78[7] = fVar134;
          pfVar78[8] = fVar127;
          pfVar78[9] = fVar128;
          pfVar78[10] = fVar129;
          pfVar78[0xb] = fVar130;
          *(ulong *)pfVar82 = CONCAT44(fStack_54,local_58);
          *(ulong *)(pfVar82 + 2) = CONCAT44(fStack_4c,fStack_50);
          pfVar82[4] = fVar123;
          pfVar82[5] = fVar124;
          pfVar82[6] = fVar125;
          pfVar82[7] = fVar126;
          pfVar82[8] = fVar119;
          pfVar82[9] = fVar120;
          pfVar82[10] = fVar121;
          pfVar82[0xb] = fVar122;
          *pfVar86 = fVar115;
          pfVar86[1] = fVar116;
          pfVar86[2] = fVar117;
          pfVar86[3] = fVar118;
          *(ulong *)(pfVar86 + 4) = local_98;
          *(ulong *)(pfVar86 + 6) = CONCAT44(fStack_8c,fStack_90);
          pfVar86[8] = fVar95;
          pfVar86[9] = fVar96;
          pfVar86[10] = fVar97;
          pfVar86[0xb] = fVar98;
          *pfVar94 = fVar111;
          pfVar94[1] = fVar112;
          pfVar94[2] = fVar113;
          pfVar94[3] = fVar114;
          pfVar94[4] = fVar107;
          pfVar94[5] = fVar108;
          pfVar94[6] = fVar109;
          pfVar94[7] = fVar110;
          pfVar94[8] = fVar99;
          pfVar94[9] = fVar100;
          pfVar94[10] = fVar101;
          pfVar94[0xb] = fVar102;
          pfVar78 = pfVar78 + 0xc;
          pfVar82 = pfVar82 + 0xc;
          pfVar86 = pfVar86 + 0xc;
          pfVar94 = pfVar94 + 0xc;
          uVar67 = uVar81 + 0xc;
          iVar83 = (int)uVar81;
          uVar81 = uVar67;
        } while (iVar83 + 0x17 < (int)uVar3);
      }
      if ((int)uVar67 + 7 < (int)uVar3) {
        ppvVar68 = ppvVar92;
        if (local_80 == (Mat *)0x0) {
          ppvVar68 = &local_48;
        }
        do {
          fVar103 = *(float *)ppvVar88;
          fVar119 = *(float *)((long)ppvVar68 + 4);
          fVar95 = *(float *)(ppvVar68 + 1);
          fVar99 = *(float *)((long)ppvVar68 + 0xc);
          iVar83 = (int)uVar67;
          fVar100 = fVar103;
          fVar101 = fVar103;
          fVar102 = fVar103;
          fVar96 = fVar119;
          fVar97 = fVar119;
          fVar98 = fVar119;
          fVar104 = fVar95;
          fVar105 = fVar95;
          fVar106 = fVar95;
          fVar107 = fVar99;
          fVar108 = fVar99;
          fVar109 = fVar99;
          fVar110 = fVar99;
          fVar111 = fVar99;
          fVar112 = fVar99;
          fVar113 = fVar99;
          fVar114 = fVar95;
          fVar115 = fVar95;
          fVar116 = fVar95;
          fVar117 = fVar95;
          fVar118 = fVar119;
          fVar120 = fVar119;
          fVar121 = fVar119;
          fVar122 = fVar119;
          fVar123 = fVar103;
          fVar124 = fVar103;
          fVar125 = fVar103;
          fVar126 = fVar103;
          if (0 < iVar85 * 4) {
            lVar77 = kernel->cstep * uVar69 * kernel->elemsize;
            pvVar5 = kernel->data;
            lVar70 = local_e8.cstep *
                     CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) *
                     (ulong)(((uint)(iVar83 + (int)((uVar67 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                            (int)((uVar67 & 0xffffffff) / 0xc));
            lVar91 = 0;
            iVar74 = iVar73;
            do {
              pfVar71 = (float *)((long)local_e8.data + lVar91 * 2 + lVar70);
              fVar131 = *pfVar71;
              fVar132 = pfVar71[1];
              fVar133 = pfVar71[2];
              fVar134 = pfVar71[3];
              pfVar71 = (float *)((long)local_e8.data + lVar91 * 2 + lVar70 + 0x10);
              fVar1 = *pfVar71;
              fVar2 = pfVar71[1];
              fVar54 = pfVar71[2];
              fVar55 = pfVar71[3];
              fVar127 = *(float *)((long)pvVar5 + lVar91 + lVar77);
              fVar128 = *(float *)((long)pvVar5 + lVar91 + lVar77 + 4);
              fVar129 = *(float *)((long)pvVar5 + lVar91 + lVar77 + 8);
              fVar130 = *(float *)((long)pvVar5 + lVar91 + lVar77 + 0xc);
              fVar123 = fVar123 + fVar127 * fVar131;
              fVar124 = fVar124 + fVar127 * fVar132;
              fVar125 = fVar125 + fVar127 * fVar133;
              fVar126 = fVar126 + fVar127 * fVar134;
              fVar103 = fVar103 + fVar127 * fVar1;
              fVar100 = fVar100 + fVar127 * fVar2;
              fVar101 = fVar101 + fVar127 * fVar54;
              fVar102 = fVar102 + fVar127 * fVar55;
              fVar118 = fVar118 + fVar128 * fVar131;
              fVar120 = fVar120 + fVar128 * fVar132;
              fVar121 = fVar121 + fVar128 * fVar133;
              fVar122 = fVar122 + fVar128 * fVar134;
              fVar119 = fVar119 + fVar128 * fVar1;
              fVar96 = fVar96 + fVar128 * fVar2;
              fVar97 = fVar97 + fVar128 * fVar54;
              fVar98 = fVar98 + fVar128 * fVar55;
              fVar114 = fVar114 + fVar129 * fVar131;
              fVar115 = fVar115 + fVar129 * fVar132;
              fVar116 = fVar116 + fVar129 * fVar133;
              fVar117 = fVar117 + fVar129 * fVar134;
              fVar95 = fVar95 + fVar129 * fVar1;
              fVar104 = fVar104 + fVar129 * fVar2;
              fVar105 = fVar105 + fVar129 * fVar54;
              fVar106 = fVar106 + fVar129 * fVar55;
              fVar110 = fVar110 + fVar131 * fVar130;
              fVar111 = fVar111 + fVar132 * fVar130;
              fVar112 = fVar112 + fVar133 * fVar130;
              fVar113 = fVar113 + fVar134 * fVar130;
              fVar99 = fVar99 + fVar130 * fVar1;
              fVar107 = fVar107 + fVar130 * fVar2;
              fVar108 = fVar108 + fVar130 * fVar54;
              fVar109 = fVar109 + fVar130 * fVar55;
              lVar91 = lVar91 + 0x10;
              iVar74 = iVar74 + -1;
            } while (iVar74 != 0);
          }
          *pfVar78 = fVar123;
          pfVar78[1] = fVar124;
          pfVar78[2] = fVar125;
          pfVar78[3] = fVar126;
          pfVar78[4] = fVar103;
          pfVar78[5] = fVar100;
          pfVar78[6] = fVar101;
          pfVar78[7] = fVar102;
          *pfVar82 = fVar118;
          pfVar82[1] = fVar120;
          pfVar82[2] = fVar121;
          pfVar82[3] = fVar122;
          pfVar82[4] = fVar119;
          pfVar82[5] = fVar96;
          pfVar82[6] = fVar97;
          pfVar82[7] = fVar98;
          *pfVar86 = fVar114;
          pfVar86[1] = fVar115;
          pfVar86[2] = fVar116;
          pfVar86[3] = fVar117;
          pfVar86[4] = fVar95;
          pfVar86[5] = fVar104;
          pfVar86[6] = fVar105;
          pfVar86[7] = fVar106;
          *pfVar94 = fVar110;
          pfVar94[1] = fVar111;
          pfVar94[2] = fVar112;
          pfVar94[3] = fVar113;
          pfVar94[4] = fVar99;
          pfVar94[5] = fVar107;
          pfVar94[6] = fVar108;
          pfVar94[7] = fVar109;
          pfVar78 = pfVar78 + 8;
          pfVar82 = pfVar82 + 8;
          pfVar86 = pfVar86 + 8;
          pfVar94 = pfVar94 + 8;
          uVar67 = (ulong)(iVar83 + 8);
        } while (iVar83 + 0xf < (int)uVar3);
      }
      else {
        uVar67 = uVar67 & 0xffffffff;
      }
      uVar75 = (uint)uVar67;
      if ((int)(uVar75 | 3) < (int)uVar3) {
        if (local_80 == (Mat *)0x0) {
          ppvVar92 = &local_48;
        }
        do {
          iVar83 = (int)uVar67;
          uVar75 = iVar83 + (int)(uVar67 / 0xc) * -0xc;
          fVar103 = *(float *)ppvVar88;
          fVar119 = *(float *)((long)ppvVar92 + 4);
          fVar95 = *(float *)(ppvVar92 + 1);
          fVar99 = *(float *)((long)ppvVar92 + 0xc);
          fVar100 = fVar103;
          fVar101 = fVar103;
          fVar102 = fVar103;
          fVar96 = fVar119;
          fVar97 = fVar119;
          fVar98 = fVar119;
          fVar104 = fVar95;
          fVar105 = fVar95;
          fVar106 = fVar95;
          fVar107 = fVar99;
          fVar108 = fVar99;
          fVar109 = fVar99;
          if (0 < iVar85 * 4) {
            lVar77 = kernel->cstep * uVar69 * kernel->elemsize;
            pvVar5 = kernel->data;
            lVar70 = 0;
            iVar74 = iVar73;
            do {
              pfVar71 = (float *)((long)local_e8.data +
                                 lVar70 + local_e8.cstep *
                                          CONCAT44(local_e8.elemsize._4_4_,
                                                   (undefined4)local_e8.elemsize) *
                                          (ulong)((uVar75 >> 3) + (int)(uVar67 / 0xc) +
                                                 (uint)((uVar75 >> 2 & 1) != 0)));
              fVar114 = *pfVar71;
              fVar115 = pfVar71[1];
              fVar116 = pfVar71[2];
              fVar117 = pfVar71[3];
              fVar110 = *(float *)((long)pvVar5 + lVar70 + lVar77);
              fVar111 = *(float *)((long)pvVar5 + lVar70 + lVar77 + 4);
              fVar112 = *(float *)((long)pvVar5 + lVar70 + lVar77 + 8);
              fVar113 = *(float *)((long)pvVar5 + lVar70 + lVar77 + 0xc);
              fVar103 = fVar103 + fVar110 * fVar114;
              fVar100 = fVar100 + fVar110 * fVar115;
              fVar101 = fVar101 + fVar110 * fVar116;
              fVar102 = fVar102 + fVar110 * fVar117;
              fVar119 = fVar119 + fVar111 * fVar114;
              fVar96 = fVar96 + fVar111 * fVar115;
              fVar97 = fVar97 + fVar111 * fVar116;
              fVar98 = fVar98 + fVar111 * fVar117;
              fVar95 = fVar95 + fVar112 * fVar114;
              fVar104 = fVar104 + fVar112 * fVar115;
              fVar105 = fVar105 + fVar112 * fVar116;
              fVar106 = fVar106 + fVar112 * fVar117;
              fVar99 = fVar99 + fVar113 * fVar114;
              fVar107 = fVar107 + fVar113 * fVar115;
              fVar108 = fVar108 + fVar113 * fVar116;
              fVar109 = fVar109 + fVar113 * fVar117;
              lVar70 = lVar70 + 0x10;
              iVar74 = iVar74 + -1;
            } while (iVar74 != 0);
          }
          *pfVar78 = fVar103;
          pfVar78[1] = fVar100;
          pfVar78[2] = fVar101;
          pfVar78[3] = fVar102;
          *pfVar82 = fVar119;
          pfVar82[1] = fVar96;
          pfVar82[2] = fVar97;
          pfVar82[3] = fVar98;
          *pfVar86 = fVar95;
          pfVar86[1] = fVar104;
          pfVar86[2] = fVar105;
          pfVar86[3] = fVar106;
          *pfVar94 = fVar99;
          pfVar94[1] = fVar107;
          pfVar94[2] = fVar108;
          pfVar94[3] = fVar109;
          pfVar78 = pfVar78 + 4;
          pfVar82 = pfVar82 + 4;
          pfVar86 = pfVar86 + 4;
          pfVar94 = pfVar94 + 4;
          uVar75 = iVar83 + 4;
          uVar67 = (ulong)uVar75;
        } while (iVar83 + 7 < (int)uVar3);
      }
      if ((int)uVar75 < (int)uVar3) {
        sVar4 = kernel->cstep;
        sVar6 = kernel->elemsize;
        pvVar5 = kernel->data;
        do {
          fVar103 = *(float *)ppvVar88;
          fVar119 = *(float *)((long)ppvVar88 + 4);
          fVar95 = *(float *)(ppvVar88 + 1);
          fVar99 = *(float *)((long)ppvVar88 + 0xc);
          if (0 < iVar85 * 4) {
            lVar77 = 0;
            pfVar71 = (float *)(sVar4 * uVar69 * sVar6 + (long)pvVar5);
            do {
              fVar100 = *(float *)((long)local_e8.data +
                                  lVar77 * 4 +
                                  (ulong)((uVar75 & 3) + (uVar75 % 0xc >> 3) + uVar75 / 0xc +
                                         (uint)((uVar75 % 0xc >> 2 & 1) != 0)) *
                                  local_e8.cstep *
                                  CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
              fVar103 = fVar103 + fVar100 * *pfVar71;
              fVar119 = fVar119 + fVar100 * pfVar71[1];
              fVar95 = fVar95 + fVar100 * pfVar71[2];
              fVar99 = fVar99 + fVar100 * pfVar71[3];
              pfVar71 = pfVar71 + 4;
              lVar77 = lVar77 + 1;
            } while (iVar73 != (int)lVar77);
          }
          *pfVar78 = fVar103;
          *pfVar82 = fVar119;
          *pfVar86 = fVar95;
          *pfVar94 = fVar99;
          pfVar78 = pfVar78 + 1;
          pfVar82 = pfVar82 + 1;
          pfVar86 = pfVar86 + 1;
          pfVar94 = pfVar94 + 1;
          uVar75 = uVar75 + 1;
        } while (uVar75 != uVar3);
      }
      uVar67 = uVar69 + 1;
      local_98 = uVar69;
    } while (uVar69 + 1 != (ulong)(uint)((int)uVar79 >> 2));
  }
  if ((int)local_64 < (int)uVar93) {
    iVar72 = iVar72 * uVar80;
    iVar85 = iVar72 * 4;
    lVar77 = (long)(int)local_64;
    do {
      if (local_80 == (Mat *)0x0) {
        fVar103 = 0.0;
      }
      else {
        fVar103 = *(float *)((long)&local_80->data + lVar77 * 4);
      }
      pfVar78 = (float *)(local_60->cstep * lVar77 * local_60->elemsize + (long)local_60->data);
      uVar67 = 0;
      uVar80 = (uint)lVar77;
      if (0xb < (int)uVar3) {
        uVar93 = uVar80 + 3;
        if (-1 < (int)uVar80) {
          uVar93 = uVar80;
        }
        uVar69 = 0;
        do {
          fVar119 = fVar103;
          fVar95 = fVar103;
          fVar99 = fVar103;
          fVar100 = fVar103;
          fVar101 = fVar103;
          fVar102 = fVar103;
          fVar96 = fVar103;
          fVar97 = fVar103;
          fVar98 = fVar103;
          fVar104 = fVar103;
          fVar105 = fVar103;
          fVar106 = fVar103;
          if (0 < iVar85) {
            pfVar82 = (float *)((uVar69 / 0xc) * local_e8.cstep *
                                CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                               (long)local_e8.data);
            lVar70 = 0;
            do {
              fVar107 = *(float *)((long)kernel->data +
                                  lVar70 * 4 +
                                  kernel->cstep *
                                  (long)(int)(((int)uVar93 >> 2) + (uVar80 - (uVar93 & 0xfffffffc)))
                                  * kernel->elemsize);
              fVar98 = fVar98 + *pfVar82 * fVar107;
              fVar104 = fVar104 + pfVar82[1] * fVar107;
              fVar105 = fVar105 + pfVar82[2] * fVar107;
              fVar106 = fVar106 + pfVar82[3] * fVar107;
              fVar101 = fVar101 + pfVar82[4] * fVar107;
              fVar102 = fVar102 + pfVar82[5] * fVar107;
              fVar96 = fVar96 + pfVar82[6] * fVar107;
              fVar97 = fVar97 + pfVar82[7] * fVar107;
              fVar119 = fVar119 + fVar107 * pfVar82[8];
              fVar95 = fVar95 + fVar107 * pfVar82[9];
              fVar99 = fVar99 + fVar107 * pfVar82[10];
              fVar100 = fVar100 + fVar107 * pfVar82[0xb];
              lVar70 = lVar70 + 1;
              pfVar82 = pfVar82 + 0xc;
            } while (iVar85 != (int)lVar70);
          }
          *pfVar78 = fVar98;
          pfVar78[1] = fVar104;
          pfVar78[2] = fVar105;
          pfVar78[3] = fVar106;
          pfVar78[4] = fVar101;
          pfVar78[5] = fVar102;
          pfVar78[6] = fVar96;
          pfVar78[7] = fVar97;
          pfVar78[8] = fVar119;
          pfVar78[9] = fVar95;
          pfVar78[10] = fVar99;
          pfVar78[0xb] = fVar100;
          pfVar78 = pfVar78 + 0xc;
          uVar67 = uVar69 + 0xc;
          iVar73 = (int)uVar69;
          uVar69 = uVar67;
        } while (iVar73 + 0x17 < (int)uVar3);
      }
      if ((int)uVar67 + 7 < (int)uVar3) {
        uVar93 = uVar80 + 3;
        if (-1 < (int)uVar80) {
          uVar93 = uVar80;
        }
        do {
          iVar73 = (int)uVar67;
          fVar119 = fVar103;
          fVar95 = fVar103;
          fVar99 = fVar103;
          fVar100 = fVar103;
          fVar101 = fVar103;
          fVar102 = fVar103;
          fVar96 = fVar103;
          fVar97 = fVar103;
          if (0 < iVar85) {
            pfVar82 = (float *)((((uint)(iVar73 + (int)((uVar67 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                                (int)((uVar67 & 0xffffffff) / 0xc)) * local_e8.cstep *
                                CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                               (long)local_e8.data);
            lVar70 = 0;
            do {
              fVar98 = *(float *)((long)kernel->data +
                                 lVar70 * 4 +
                                 kernel->cstep *
                                 (long)(int)(((int)uVar93 >> 2) + (uVar80 - (uVar93 & 0xfffffffc)))
                                 * kernel->elemsize);
              fVar101 = fVar101 + *pfVar82 * fVar98;
              fVar102 = fVar102 + pfVar82[1] * fVar98;
              fVar96 = fVar96 + pfVar82[2] * fVar98;
              fVar97 = fVar97 + pfVar82[3] * fVar98;
              fVar119 = fVar119 + fVar98 * pfVar82[4];
              fVar95 = fVar95 + fVar98 * pfVar82[5];
              fVar99 = fVar99 + fVar98 * pfVar82[6];
              fVar100 = fVar100 + fVar98 * pfVar82[7];
              lVar70 = lVar70 + 1;
              pfVar82 = pfVar82 + 8;
            } while (iVar85 != (int)lVar70);
          }
          *pfVar78 = fVar101;
          pfVar78[1] = fVar102;
          pfVar78[2] = fVar96;
          pfVar78[3] = fVar97;
          pfVar78[4] = fVar119;
          pfVar78[5] = fVar95;
          pfVar78[6] = fVar99;
          pfVar78[7] = fVar100;
          pfVar78 = pfVar78 + 8;
          uVar67 = (ulong)(iVar73 + 8);
        } while (iVar73 + 0xf < (int)uVar3);
      }
      else {
        uVar67 = uVar67 & 0xffffffff;
      }
      uVar93 = (uint)uVar67;
      if ((int)(uVar93 | 3) < (int)uVar3) {
        uVar79 = uVar80 + 3;
        if (-1 < (int)uVar80) {
          uVar79 = uVar80;
        }
        do {
          iVar73 = (int)uVar67;
          fVar119 = fVar103;
          fVar95 = fVar103;
          fVar99 = fVar103;
          fVar100 = fVar103;
          if (0 < iVar85) {
            uVar93 = iVar73 + (int)(uVar67 / 0xc) * -0xc;
            pfVar82 = (float *)(((uVar93 >> 3) + (int)(uVar67 / 0xc) +
                                (uint)((uVar93 >> 2 & 1) != 0)) * local_e8.cstep *
                                CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize) +
                               (long)local_e8.data);
            lVar70 = 0;
            do {
              fVar101 = *(float *)((long)kernel->data +
                                  lVar70 * 4 +
                                  kernel->cstep *
                                  (long)(int)(((int)uVar79 >> 2) + (uVar80 - (uVar79 & 0xfffffffc)))
                                  * kernel->elemsize);
              fVar119 = fVar119 + fVar101 * *pfVar82;
              fVar95 = fVar95 + fVar101 * pfVar82[1];
              fVar99 = fVar99 + fVar101 * pfVar82[2];
              fVar100 = fVar100 + fVar101 * pfVar82[3];
              pfVar82 = pfVar82 + 4;
              lVar70 = lVar70 + 1;
            } while (iVar85 != (int)lVar70);
          }
          *pfVar78 = fVar119;
          pfVar78[1] = fVar95;
          pfVar78[2] = fVar99;
          pfVar78[3] = fVar100;
          pfVar78 = pfVar78 + 4;
          uVar93 = iVar73 + 4;
          uVar67 = (ulong)uVar93;
        } while (iVar73 + 7 < (int)uVar3);
      }
      if ((int)uVar93 < (int)uVar3) {
        uVar79 = uVar80 + 3;
        if (-1 < (int)uVar80) {
          uVar79 = uVar80;
        }
        sVar4 = kernel->cstep;
        sVar6 = kernel->elemsize;
        pvVar5 = kernel->data;
        do {
          if (iVar72 < 1) {
            fVar119 = 0.0;
            fVar95 = 0.0;
            fVar99 = 0.0;
            fVar100 = 0.0;
          }
          else {
            fVar119 = 0.0;
            fVar95 = 0.0;
            fVar99 = 0.0;
            fVar100 = 0.0;
            lVar70 = 0;
            iVar73 = iVar72;
            do {
              pfVar82 = (float *)((long)pvVar5 +
                                 lVar70 + (long)(int)(((int)uVar79 >> 2) +
                                                     (uVar80 - (uVar79 & 0xfffffffc))) * sVar4 *
                                          sVar6);
              pfVar86 = (float *)((long)local_e8.data +
                                 lVar70 + (ulong)((uVar93 & 3) + (uVar93 % 0xc >> 3) + uVar93 / 0xc
                                                 + (uint)((uVar93 % 0xc >> 2 & 1) != 0)) *
                                          local_e8.cstep *
                                          CONCAT44(local_e8.elemsize._4_4_,
                                                   (undefined4)local_e8.elemsize));
              fVar119 = fVar119 + *pfVar82 * *pfVar86;
              fVar95 = fVar95 + pfVar82[1] * pfVar86[1];
              fVar99 = fVar99 + pfVar82[2] * pfVar86[2];
              fVar100 = fVar100 + pfVar82[3] * pfVar86[3];
              lVar70 = lVar70 + 0x10;
              iVar73 = iVar73 + -1;
            } while (iVar73 != 0);
          }
          *pfVar78 = fVar100 + fVar95 + fVar103 + fVar99 + fVar119;
          pfVar78 = pfVar78 + 1;
          uVar93 = uVar93 + 1;
        } while (uVar93 != uVar3);
      }
      lVar77 = lVar77 + 1;
    } while (lVar77 != local_70);
  }
  piVar66 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar66 != (int *)0x0) {
    LOCK();
    *piVar66 = *piVar66 + -1;
    UNLOCK();
    if (*piVar66 == 0) {
      local_78 = lVar89;
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to1_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u * 4, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    Mat tmp;
    if (size >= 12)
        tmp.create(12 * maxk, inch, size / 12 + (size % 12) / 8 + (size % 12 % 8) / 4 + size % 12 % 4, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u * 4, 4, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u * 4, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u * 4, 4, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size / 12;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 12;

            float* tmpptr = tmp.channel(i / 12);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x12
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);
                    __m128 _r8 = _mm_load_ps(img0 + 4 * 8);
                    __m128 _r9 = _mm_load_ps(img0 + 4 * 9);
                    __m128 _ra = _mm_load_ps(img0 + 4 * 10);
                    __m128 _rb = _mm_load_ps(img0 + 4 * 11);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                    _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r8);
                    _mm_store_ps(tmpptr + 4 * 3, _r1);
                    _mm_store_ps(tmpptr + 4 * 4, _r5);
                    _mm_store_ps(tmpptr + 4 * 5, _r9);
                    _mm_store_ps(tmpptr + 4 * 6, _r2);
                    _mm_store_ps(tmpptr + 4 * 7, _r6);
                    _mm_store_ps(tmpptr + 4 * 8, _ra);
                    _mm_store_ps(tmpptr + 4 * 9, _r3);
                    _mm_store_ps(tmpptr + 4 * 10, _r7);
                    _mm_store_ps(tmpptr + 4 * 11, _rb);

                    img0 += size * 4;
                    tmpptr += 48;
                }
            }
        }

        remain_size_start += nn_size * 12;
        nn_size = (size - remain_size_start) >> 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    img0 += size * 4;
                    tmpptr += 16;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    int nn_outch = outch / 4;
    int remain_outch_start = nn_outch * 4;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);
        float* outptr2 = top_blob.channel(p + 2);
        float* outptr3 = top_blob.channel(p + 3);

        const float zeros[4] = {0.f};
        const float* biasptr = bias ? bias + p : zeros;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr);
            __m128 _sum2 = _mm_load1_ps(biasptr);
            __m128 _sum3 = _mm_load1_ps(biasptr + 1);
            __m128 _sum4 = _mm_load1_ps(biasptr + 1);
            __m128 _sum5 = _mm_load1_ps(biasptr + 1);
            __m128 _sum6 = _mm_load1_ps(biasptr + 2);
            __m128 _sum7 = _mm_load1_ps(biasptr + 2);
            __m128 _sum8 = _mm_load1_ps(biasptr + 2);
            __m128 _sum9 = _mm_load1_ps(biasptr + 3);
            __m128 _suma = _mm_load1_ps(biasptr + 3);
            __m128 _sumb = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _val2 = _mm_load_ps(tmpptr + 8);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val0, _w1, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val1, _w1, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val2, _w1, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val0, _w2, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val1, _w2, _sum7);
                _sum8 = _mm_comp_fmadd_ps(_val2, _w2, _sum8);
                _sum9 = _mm_comp_fmadd_ps(_val0, _w3, _sum9);
                _suma = _mm_comp_fmadd_ps(_val1, _w3, _suma);
                _sumb = _mm_comp_fmadd_ps(_val2, _w3, _sumb);

                tmpptr += 12;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr1, _sum3);
            _mm_store_ps(outptr1 + 4, _sum4);
            _mm_store_ps(outptr1 + 8, _sum5);
            _mm_store_ps(outptr2, _sum6);
            _mm_store_ps(outptr2 + 4, _sum7);
            _mm_store_ps(outptr2 + 8, _sum8);
            _mm_store_ps(outptr3, _sum9);
            _mm_store_ps(outptr3 + 4, _suma);
            _mm_store_ps(outptr3 + 8, _sumb);

            outptr0 += 12;
            outptr1 += 12;
            outptr2 += 12;
            outptr3 += 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr);
            __m128 _sum2 = _mm_load1_ps(biasptr + 1);
            __m128 _sum3 = _mm_load1_ps(biasptr + 1);
            __m128 _sum4 = _mm_load1_ps(biasptr + 2);
            __m128 _sum5 = _mm_load1_ps(biasptr + 2);
            __m128 _sum6 = _mm_load1_ps(biasptr + 3);
            __m128 _sum7 = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val0, _w1, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val1, _w1, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val0, _w2, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val1, _w2, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val0, _w3, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val1, _w3, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr1, _sum2);
            _mm_store_ps(outptr1 + 4, _sum3);
            _mm_store_ps(outptr2, _sum4);
            _mm_store_ps(outptr2 + 4, _sum5);
            _mm_store_ps(outptr3, _sum6);
            _mm_store_ps(outptr3 + 4, _sum7);

            outptr0 += 8;
            outptr1 += 8;
            outptr2 += 8;
            outptr3 += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_load1_ps(biasptr);
            __m128 _sum1 = _mm_load1_ps(biasptr + 1);
            __m128 _sum2 = _mm_load1_ps(biasptr + 2);
            __m128 _sum3 = _mm_load1_ps(biasptr + 3);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);

                __m128 _w0 = _mm_load1_ps(kptr0);
                __m128 _w1 = _mm_load1_ps(kptr0 + 1);
                __m128 _w2 = _mm_load1_ps(kptr0 + 2);
                __m128 _w3 = _mm_load1_ps(kptr0 + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val0, _w1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val0, _w2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val0, _w3, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr1, _sum1);
            _mm_store_ps(outptr2, _sum2);
            _mm_store_ps(outptr3, _sum3);

            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);
            const float* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _w0 = _mm_load_ps(kptr0);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            float sum[4];
            _mm_storeu_ps(sum, _sum);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];

            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        int i = 0;
        for (; i + 11 < size; i += 12)
        {
            const float* tmpptr = tmp.channel(i / 12);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);
            __m128 _sum1 = _mm_set1_ps(bias0);
            __m128 _sum2 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _val2 = _mm_load_ps(tmpptr + 8);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_w0, _val2, _sum2);

                tmpptr += 12;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);
            _mm_storeu_ps(outptr0 + 4, _sum1);
            _mm_storeu_ps(outptr0 + 8, _sum2);

            outptr0 += 12;
        }
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);
            __m128 _sum1 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _val1 = _mm_load_ps(tmpptr + 4);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);

                tmpptr += 8;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);
            _mm_storeu_ps(outptr0 + 4, _sum1);

            outptr0 += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk * 4; // inch always > 0

            __m128 _sum0 = _mm_set1_ps(bias0);

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _w0 = _mm_load1_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);

                tmpptr += 4;
                kptr0 += 1;
            }

            _mm_storeu_ps(outptr0, _sum0);

            outptr0 += 4;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + i % 12 % 4);
            const float* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            float sum0 = bias0;

            __m128 _sum0 = _mm_setzero_ps();

            for (int j = 0; j < nn; j++)
            {
                __m128 _val0 = _mm_load_ps(tmpptr);
                __m128 _w0 = _mm_load_ps(kptr0);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);

                tmpptr += 4;
                kptr0 += 4;
            }

            sum0 += _mm_reduce_add_ps(_sum0);

            outptr0[0] = sum0;

            outptr0 += 1;
        }
    }
}